

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stat.h
# Opt level: O1

ostream * operator<<(ostream *out,Stat<int> *stat)

{
  long lVar1;
  ostream oVar2;
  ostream *poVar3;
  double dVar4;
  
  lVar1 = *(long *)out;
  *(uint *)(out + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(lVar1 + -0x18) + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(out + *(long *)(lVar1 + -0x18) + 8) = 4;
  poVar3 = out + *(long *)(lVar1 + -0x18);
  if (out[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
    oVar2 = (ostream)std::ios::widen((char)poVar3);
    poVar3[0xe0] = oVar2;
    poVar3[0xe1] = (ostream)0x1;
  }
  poVar3[0xe0] = (ostream)0x20;
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 7;
  std::__ostream_insert<char,std::char_traits<char>>(out,"range: [",8);
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 7;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)out,stat->minValue);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  std::ostream::operator<<((ostream *)poVar3,stat->maxValue);
  std::__ostream_insert<char,std::char_traits<char>>(out,"], mean: ",9);
  dVar4 = 0.0;
  if (stat->cnt != 0) {
    dVar4 = (double)((float)stat->sum / (float)stat->cnt);
  }
  poVar3 = std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", cnt: ",7);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(out,", sumOfSquares: ",0x10);
  dVar4 = 0.0;
  if (stat->cnt != 0) {
    dVar4 = (double)((float)stat->sumOfSquares / (float)stat->cnt);
  }
  std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(out,", ref: ",7);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)out,stat->ref);
  return poVar3;
}

Assistant:

std::ostream &operator<<( std::ostream &out, const Stat<M> &stat )
{
    int defPrecision = 4;
    int defWidth = defPrecision + 3;
    out << std::fixed << std::setprecision( defPrecision ) << std::setfill( ' ' ) << std::setw( defWidth );
    out << "range: [" << std::setw( defWidth ) << stat.GetMin() << " " << stat.GetMax();
    out << "], mean: " << stat.GetMean() << ", cnt: " << stat.GetCnt();
    out << ", sumOfSquares: " << stat.GetMeanSquare();
    return out << ", ref: " << stat.GetRef();
}